

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,FunctionDeclarationNode *node)

{
  undefined1 auVar1 [8];
  _List_node_base *p_Var2;
  TypeName type;
  string name;
  undefined1 local_90 [8];
  shared_ptr<RuntimeSymbol> local_88;
  undefined1 local_74 [4];
  string local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  local_50;
  
  std::__cxx11::string::string((string *)(local_74 + 4),(string *)&node->name_);
  local_74 = (undefined1  [4])node->returnType_;
  std::
  make_unique<RuntimeFunctionSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<BlockNode>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (TypeName *)(local_74 + 4),(shared_ptr<BlockNode> *)local_74);
  p_Var2 = (_List_node_base *)&node->arguments_;
  while (auVar1 = local_90,
        p_Var2 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                    *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&node->arguments_) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName,_true>
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1),
               (TypeName *)(p_Var2 + 3));
    std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::push_back((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                 *)((long)auVar1 + 0x30),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<RuntimeFunctionSymbol,std::default_delete<RuntimeFunctionSymbol>,void>
            ((__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_> *)
             local_90);
  Context::addSymbol(&this->context_,(string *)(local_74 + 4),&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  std::__cxx11::string::~string((string *)(local_74 + 4));
  return;
}

Assistant:

void Executor::visit(const FunctionDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getReturnType();
  auto symbol = std::make_unique<RuntimeFunctionSymbol>(name, type, node.getBody());
  for(const auto& arg : node.getArguments())
  {
    symbol->addArgument(RuntimeFunctionSymbol::Argument{arg.first, arg.second});
  }

  context_.addSymbol(name, std::move(symbol));
}